

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_type_enum_value_pos(lysp_yang_ctx *ctx,ly_stmt val_kw,lysp_type_enum *enm)

{
  char cVar1;
  ulong uVar2;
  LY_ERR LVar3;
  char *pcVar4;
  int *piVar5;
  ulonglong uVar6;
  char *pcVar7;
  char *format;
  ly_ctx *plVar8;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *ptr;
  char *buf;
  ly_stmt local_54;
  char *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  if ((*(uint *)&enm->flags >> 9 & 1) == 0) {
    enm->flags = (ushort)*(uint *)&enm->flags | 0x200;
    LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_50,&local_38,&local_48);
    uVar2 = local_48;
    pcVar7 = local_50;
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (((local_48 == 0) || (cVar1 = *local_50, cVar1 == '+')) || (local_48 != 1 && cVar1 == '0')) {
LAB_00172b03:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
LAB_00172b6e:
      pcVar4 = lyplg_ext_stmt2str(val_kw);
      format = "Invalid value \"%.*s\" of \"%s\".";
    }
    else {
      if (val_kw == LY_STMT_POSITION) {
        if ((cVar1 == '-') && (local_50[1] == '0')) goto LAB_00172b03;
        piVar5 = __errno_location();
        *piVar5 = 0;
LAB_00172c34:
        uVar6 = strtoull(pcVar7,&local_40,10);
        if (uVar6 >> 0x20 == 0) {
LAB_00172c4f:
          if ((long)local_40 - (long)pcVar7 == uVar2) {
            if (*piVar5 != 0x22) {
              enm->value = uVar6;
              LVar3 = get_keyword(ctx,&local_54,&local_50,&local_48);
              if ((LVar3 != LY_SUCCESS) ||
                 (LVar3 = LY_SUCCESS, local_54 == LY_STMT_SYNTAX_SEMICOLON)) goto LAB_00172b9c;
              if (local_54 == LY_STMT_SYNTAX_LEFT_BRACE) {
                LVar3 = get_keyword(ctx,&local_54,&local_50,&local_48);
                if ((LVar3 == LY_SUCCESS) &&
                   (LVar3 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
                  do {
                    if (local_54 != LY_STMT_EXTENSION_INSTANCE) {
                      if (ctx == (lysp_yang_ctx *)0x0) {
                        plVar8 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar8 = (ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      }
                      pcVar7 = lyplg_ext_stmt2str(local_54);
                      pcVar4 = lyplg_ext_stmt2str(val_kw);
                      ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                              "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,pcVar4);
                      goto LAB_00172b97;
                    }
                    LVar3 = parse_ext(ctx,local_50,local_48,enm,val_kw,0,&enm->exts);
                  } while (((LVar3 == LY_SUCCESS) &&
                           (LVar3 = get_keyword(ctx,&local_54,&local_50,&local_48),
                           LVar3 == LY_SUCCESS)) &&
                          (LVar3 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE));
                }
                goto LAB_00172b9c;
              }
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(local_54);
              pcVar4 = "Invalid keyword \"%s\", expected \";\" or \"{\".";
              goto LAB_00172b53;
            }
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar8 = (ly_ctx *)0x0;
            }
            else {
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar4 = lyplg_ext_stmt2str(val_kw);
            format = "Value \"%.*s\" is out of \"%s\" bounds.";
            goto LAB_00172b83;
          }
        }
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        goto LAB_00172b6e;
      }
      piVar5 = __errno_location();
      *piVar5 = 0;
      if (val_kw != LY_STMT_VALUE) goto LAB_00172c34;
      uVar6 = strtoll(pcVar7,&local_40,10);
      if ((long)(int)uVar6 == uVar6) goto LAB_00172c4f;
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = lyplg_ext_stmt2str(LY_STMT_VALUE);
      format = "Invalid value \"%.*s\" of \"%s\".";
    }
LAB_00172b83:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,uVar2 & 0xffffffff,pcVar7,pcVar4);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar7 = lyplg_ext_stmt2str(val_kw);
    pcVar4 = "Duplicate keyword \"%s\".";
LAB_00172b53:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,pcVar4,pcVar7);
  }
LAB_00172b97:
  LVar3 = LY_EVALID;
LAB_00172b9c:
  free(local_38);
  return LVar3;
}

Assistant:

LY_ERR
parse_type_enum_value_pos(struct lysp_yang_ctx *ctx, enum ly_stmt val_kw, struct lysp_type_enum *enm)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    long long num = 0;
    unsigned long long unum = 0;
    enum ly_stmt kw;

    if (enm->flags & LYS_SET_VALUE) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    enm->flags |= LYS_SET_VALUE;

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if (!word_len || (word[0] == '+') || ((word[0] == '0') && (word_len > 1)) || ((val_kw == LY_STMT_POSITION) && !strncmp(word, "-0", 2))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    if (val_kw == LY_STMT_VALUE) {
        num = strtoll(word, &ptr, LY_BASE_DEC);
        if ((num < INT64_C(-2147483648)) || (num > INT64_C(2147483647))) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
    } else {
        unum = strtoull(word, &ptr, LY_BASE_DEC);
        if (unum > UINT64_C(4294967295)) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
    }
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    if (errno == ERANGE) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, lyplg_ext_stmt2str(val_kw));
        ret = LY_EVALID;
        goto cleanup;
    }
    if (val_kw == LY_STMT_VALUE) {
        enm->value = num;
    } else {
        enm->value = unum;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            ret = parse_ext(ctx, word, word_len, enm, val_kw, 0, &enm->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(val_kw));
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}